

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GazetteerValidator.cpp
# Opt level: O2

Result * CoreML::validate<(MLModelType)2004>(Result *__return_storage_ptr__,Model *format)

{
  bool bVar1;
  Gazetteer *this;
  StringVector *pSVar2;
  Result *this_00;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  ModelDescription *pMVar3;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  allocator_type local_8d;
  TypeCase local_8c;
  undefined1 local_88 [40];
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  local_60;
  Result result;
  
  pMVar3 = format->description_;
  if (pMVar3 == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] != 0x7d4) {
    std::__cxx11::string::string((string *)&result,"Model not a gazetteer.",(allocator *)local_88);
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)&result);
    this_00 = &result;
    goto LAB_0020cbbe;
  }
  Result::Result(&result);
  local_8c = kStringType;
  __l._M_len = 1;
  __l._M_array = &local_8c;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)&local_60,__l,&local_8d);
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_88,(CoreML *)&pMVar3->input_,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_60,in_R8
            );
  Result::operator=(&result,(Result *)local_88);
  std::__cxx11::string::~string((string *)(local_88 + 8));
  std::
  _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::~_Vector_base(&local_60);
  bVar1 = Result::good(&result);
  if (bVar1) {
    local_8c = kStringType;
    __l_00._M_len = 1;
    __l_00._M_array = &local_8c;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)&local_60,__l_00,&local_8d);
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_88,(CoreML *)&pMVar3->output_,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)&local_60,
               in_R8);
    Result::operator=(&result,(Result *)local_88);
    std::__cxx11::string::~string((string *)(local_88 + 8));
    std::
    _Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::~_Vector_base(&local_60);
    bVar1 = Result::good(&result);
    if (!bVar1) goto LAB_0020cb52;
    this = Specification::Model::gazetteer(format);
    if (this->revision_ < 2) {
      std::__cxx11::string::string
                ((string *)local_88,"Model revision number missing or invalid. Must be >= 2",
                 (allocator *)&local_60);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_88);
    }
    else if (this->_oneof_case_[0] == 0) {
LAB_0020cb61:
      std::__cxx11::string::string
                ((string *)local_88,
                 "Model output class label not set. Must have at least one class label",
                 (allocator *)&local_60);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_88);
    }
    else {
      if (this->_oneof_case_[0] == 200) {
        pSVar2 = Specification::CoreMLModels::Gazetteer::stringclasslabels(this);
        if ((pSVar2->vector_).super_RepeatedPtrFieldBase.current_size_ < 1) goto LAB_0020cb61;
      }
      if (((this->modelparameterdata_).ptr_)->_M_string_length != 0) goto LAB_0020cb52;
      std::__cxx11::string::string
                ((string *)local_88,"Model parameter data not set",(allocator *)&local_60);
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_88);
    }
    std::__cxx11::string::~string((string *)local_88);
  }
  else {
LAB_0020cb52:
    Result::Result(__return_storage_ptr__,&result);
  }
  this_00 = (Result *)&result.m_message;
LAB_0020cbbe:
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_gazetteer>(const Specification::Model& format) {
        const auto& interface = format.description();
        
        // make sure model is a gazetteer
        if (!format.has_gazetteer()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a gazetteer.");
        }
        
        Result result;
        
        // Validate the inputs: only one input with string type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the output: only one output feature with string type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kStringType});
        if (!result.good()) {
            return result;
        }
        
        // Validate the model parameters
        const auto &gazetteer = format.gazetteer();
        if (gazetteer.revision() < 2) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model revision number missing or invalid. Must be >= 2");
        }
        
        int numClassLabels;
        switch (gazetteer.ClassLabels_case()) {
            case Specification::CoreMLModels::Gazetteer::kStringClassLabels:
                numClassLabels = gazetteer.stringclasslabels().vector_size();
                break;
            case Specification::CoreMLModels::Gazetteer::CLASSLABELS_NOT_SET:
                numClassLabels = -1;
                break;
        }
        
        if (numClassLabels <= 0) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model output class label not set. Must have at least one class label");
        }
        
        if (gazetteer.modelparameterdata().empty()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model parameter data not set");
        }
        
        return result;
    }